

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QOpenGLTexture *t)

{
  bool bVar1;
  QOpenGLTexturePrivate *this;
  QDebug *pQVar2;
  QScopedPointer<QOpenGLTexturePrivate,_QScopedPointerDeleter<QOpenGLTexturePrivate>_> *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QOpenGLTexturePrivate *d;
  QDebugStateSaver saver;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  Stream *this_00;
  QDebug *in_stack_ffffffffffffff38;
  DepthStencilMode value;
  QDebug *dbg;
  QDebug local_a0;
  QDebug in_stack_ffffffffffffff68;
  QDebug local_90;
  QDebug local_88;
  QDebug local_80;
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  QDebug local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  dbg = in_RSI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff68.stream);
  if (in_RDX == (QScopedPointer<QOpenGLTexturePrivate,_QScopedPointerDeleter<QOpenGLTexturePrivate>_>
                 *)0x0) {
    QDebug::operator<<((QDebug *)this_00,(char)(in_stack_ffffffffffffff1c >> 0x18));
  }
  else {
    this = QScopedPointer<QOpenGLTexturePrivate,_QScopedPointerDeleter<QOpenGLTexturePrivate>_>::
           data(in_RDX);
    value = (DepthStencilMode)((ulong)in_RDX >> 0x20);
    QDebug::QDebug(&local_30,in_RSI);
    operator<<(dbg,value);
    pQVar2 = QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::QDebug(&local_20,pQVar2);
    operator<<(dbg,value);
    QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff1c);
    QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff1c);
    QDebug::~QDebug(&local_18);
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug(&local_28);
    QDebug::~QDebug(&local_30);
    if (this->target == Target3D) {
      QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
      QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff1c);
    }
    pQVar2 = QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::QDebug(&local_40,pQVar2);
    operator<<(dbg,value);
    QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff1c);
    QDebug::~QDebug(&local_38);
    QDebug::~QDebug(&local_40);
    bVar1 = QOpenGLTexture::isCreated((QOpenGLTexture *)this_00);
    if (bVar1) {
      QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
      QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff1c);
    }
    bVar1 = QOpenGLTexture::isBound((QOpenGLTexture *)this_00);
    if (bVar1) {
      QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    }
    bVar1 = QOpenGLTexture::isTextureView((QOpenGLTexture *)this_00);
    if (bVar1) {
      QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    }
    if ((this->fixedSamplePositions & 1U) != 0) {
      QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    }
    QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff1c);
    QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff1c);
    QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff1c);
    QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff1c);
    pQVar2 = QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::QDebug(&local_a0,pQVar2);
    operator<<(dbg,value);
    pQVar2 = QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::QDebug(&local_90,pQVar2);
    operator<<(dbg,value);
    QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff1c);
    pQVar2 = QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::QDebug(&local_80,pQVar2);
    operator<<<QFlags<QOpenGLTexture::Feature>,_true>
              (dbg,(QFlags<QOpenGLTexture::Feature>)
                   (this->features).super_QFlagsStorageHelper<QOpenGLTexture::Feature,_4>.
                   super_QFlagsStorage<QOpenGLTexture::Feature>.i);
    pQVar2 = QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::QDebug(&local_70,pQVar2);
    operator<<(dbg,value);
    pQVar2 = QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::QDebug(&local_60,pQVar2);
    operator<<(dbg,value);
    pQVar2 = QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffff68.stream);
    QDebug::QDebug(&local_50,pQVar2);
    operator<<(dbg,value);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug(&local_68);
    QDebug::~QDebug(&local_70);
    QDebug::~QDebug(&local_78);
    QDebug::~QDebug(&local_80);
    QDebug::~QDebug(&local_88);
    QDebug::~QDebug(&local_90);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffff68);
    QDebug::~QDebug(&local_a0);
  }
  QDebug::operator<<((QDebug *)this_00,(char)(in_stack_ffffffffffffff1c >> 0x18));
  QDebug::QDebug((QDebug *)this_00,
                 (QDebug *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

QDebug operator<<(QDebug debug, const QOpenGLTexture *t)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    debug << "QOpenGLTexture(";
    if (t) {
        const QOpenGLTexturePrivate *d = t->d_ptr.data();
        debug << d->target << ", bindingTarget=" << d->bindingTarget
            << ", size=[" << d->dimensions[0]
            << ", " << d->dimensions[1];
        if (d->target == QOpenGLTexture::Target3D)
            debug << ", " << d->dimensions[2];
        debug << "], format=" << d->format << ", formatClass=" << d->formatClass;
        if (t->isCreated())
            debug << ", textureId=" << d->textureId;
        if (t->isBound())
            debug << ", [bound]";
        if (t->isTextureView())
            debug << ", [view]";
        if (d->fixedSamplePositions)
            debug << ", [fixedSamplePositions]";
        debug << ", mipLevels=" << d->requestedMipLevels << ", layers=" << d->layers
            << ", faces=" << d->faces << ", samples=" << d->samples
            << ", depthStencilMode=" << d->depthStencilMode << ", comparisonFunction="
            << d->comparisonFunction << ", comparisonMode=" << d->comparisonMode
            << ", features=" << d->features << ", minificationFilter=" << d->minFilter
            << ", magnificationFilter=" << d->magFilter << ", wrapMode=" << d->wrapModes[0];
    } else {
        debug << '0';
    }
    debug << ')';
    return debug;
}